

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O3

int __thiscall
booster::locale::util::gregorian_calendar::difference
          (gregorian_calendar *this,abstract_calendar *other_cal,period_mark p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  gregorian_calendar *other;
  undefined4 extraout_var;
  int iVar7;
  long lVar8;
  int diff;
  gregorian_calendar *pgVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  if (other_cal == (abstract_calendar *)0x0) {
LAB_001a8343:
    iVar5 = (**(this->super_abstract_calendar)._vptr_abstract_calendar)(this);
    other = (gregorian_calendar *)CONCAT44(extraout_var,iVar5);
    (*other_cal->_vptr_abstract_calendar[5])(other_cal);
    (*(other->super_abstract_calendar)._vptr_abstract_calendar[4])(other);
    pgVar9 = other;
  }
  else {
    other = (gregorian_calendar *)__dynamic_cast(other_cal,&abstract_calendar::typeinfo,&typeinfo,0)
    ;
    pgVar9 = (gregorian_calendar *)0x0;
    if (other == (gregorian_calendar *)0x0) goto LAB_001a8343;
  }
  switch(p) {
  case year:
  case extended_year:
    iVar5 = get_diff(this,year,(other->tm_).tm_year - (this->tm_).tm_year,other);
    break;
  case month:
    iVar5 = get_diff(this,month,
                     (((other->tm_).tm_year - (this->tm_).tm_year) * 0xc + (other->tm_).tm_mon) -
                     (this->tm_).tm_mon,other);
    break;
  case day:
  case day_of_year:
  case day_of_week:
  case day_of_week_local:
    iVar10 = 1;
    goto LAB_001a8399;
  case day_of_week_in_month:
  case week_of_year:
  case week_of_month:
    iVar10 = 7;
LAB_001a8399:
    diff = (other->tm_).tm_yday - (this->tm_).tm_yday;
    iVar5 = (other->tm_).tm_year;
    iVar2 = (this->tm_).tm_year;
    if (iVar5 - iVar2 != 0) {
      iVar1 = iVar5 + 0x76b;
      iVar3 = (int)((ulong)((long)iVar1 * -0x51eb851f) >> 0x20);
      iVar11 = iVar5 + 0x76e;
      if (-1 < iVar1) {
        iVar11 = iVar1;
      }
      iVar12 = iVar2 + 0x76b;
      iVar4 = (int)((ulong)((long)iVar12 * -0x51eb851f) >> 0x20);
      iVar7 = iVar2 + 0x76e;
      if (-1 < iVar12) {
        iVar7 = iVar12;
      }
      diff = ((iVar12 / 100 + ((iVar4 >> 7) - (iVar4 >> 0x1f)) +
              (iVar11 >> 2) + ((iVar3 >> 5) - (iVar3 >> 0x1f)) + iVar1 / 400 + diff) - (iVar7 >> 2))
             + (iVar5 - iVar2) * 0x16d;
    }
    iVar5 = get_diff(this,day,diff,other);
    iVar5 = iVar5 / iVar10;
    break;
  case hour:
  case hour_12:
    lVar8 = other->time_ - this->time_;
    uVar6 = (uint)((int)(lVar8 / 0x384000000) + (int)(lVar8 >> 0x3f)) >> 0x1f;
    iVar5 = (int)(SUB168(SEXT816(lVar8) * SEXT816(0x48d159e26af37c05),8) >> 10);
    goto LAB_001a8530;
  case am_pm:
    lVar8 = other->time_ - this->time_;
    uVar6 = (uint)((int)(lVar8 / 0xa8c000000) + (int)(lVar8 >> 0x3f)) >> 0x1f;
    iVar5 = (int)(SUB168(SEXT816(lVar8) * SEXT816(0x1845c8a0ce512957),8) >> 0xc);
    goto LAB_001a8530;
  case minute:
    lVar8 = other->time_ - this->time_;
    uVar6 = (uint)((int)(lVar8 / 0x1e0000000) + (int)(lVar8 >> 0x3f)) >> 0x1f;
    iVar5 = (int)(SUB168(SEXT816(lVar8) * ZEXT816(0x8888888888888889),8) >> 5);
LAB_001a8530:
    iVar5 = iVar5 + uVar6;
    break;
  case second:
    iVar5 = (int)other->time_ - (int)this->time_;
    break;
  default:
    iVar5 = 0;
  }
  if (pgVar9 != (gregorian_calendar *)0x0) {
    (*(pgVar9->super_abstract_calendar)._vptr_abstract_calendar[0xe])(pgVar9);
  }
  return iVar5;
}

Assistant:

virtual int difference(abstract_calendar const *other_cal,period::marks::period_mark p) const 
            {
                std::unique_ptr<gregorian_calendar> keeper;
                gregorian_calendar const *other = dynamic_cast<gregorian_calendar const *>(other_cal);
                if(!other) {
                    keeper.reset(clone());
                    keeper->set_time(other_cal->get_time());
                    other = keeper.get();
                }

                int factor = 1; // for weeks vs days handling

                using namespace period::marks;
                switch(p) {
                case era:
                    return 0;
                case year:
                case extended_year:
                    {
                        int diff = other->tm_.tm_year - tm_.tm_year;
                        return get_diff(period::marks::year,diff,other);
                    }
                case month:
                    {
                        int diff = 12 * (other->tm_.tm_year - tm_.tm_year) 
                                    + other->tm_.tm_mon - tm_.tm_mon;
                        return get_diff(period::marks::month,diff,other);
                    }
                case day_of_week_in_month:
                case week_of_month:
                case week_of_year:
                    factor = 7;
                    // fall 
                case day:
                case day_of_year:
                case day_of_week:
                case day_of_week_local:
                    {
                        int diff = other->tm_.tm_yday - tm_.tm_yday;
                        if(other->tm_.tm_year != tm_.tm_year) {
                            diff += days_from_0(other->tm_.tm_year + 1900) -
                                    days_from_0(tm_.tm_year + 1900);
                        }
                        return get_diff(period::marks::day,diff,other) / factor;
                    }
                case am_pm:
                    return static_cast<int>( (other->time_ - time_) / (3600*12) );
                case hour:
                case hour_12:
                    return static_cast<int>( (other->time_ - time_) / 3600 );
                case minute:
                    return static_cast<int>( (other->time_ - time_) / 60 );
                case second:
                    return static_cast<int>( other->time_ - time_  );
                default:
                    return 0;
                };
            }